

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O1

void __thiscall luna::OpenFileFail::OpenFileFail(OpenFileFail *this,string *file)

{
  (this->super_Exception).what_._M_dataplus._M_p = (pointer)&(this->super_Exception).what_.field_2;
  (this->super_Exception).what_._M_string_length = 0;
  (this->super_Exception).what_.field_2._M_local_buf[0] = '\0';
  Exception::SetWhat<std::__cxx11::string_const&>(&this->super_Exception,file);
  return;
}

Assistant:

explicit OpenFileFail(const std::string &file)
        {
            SetWhat(file);
        }